

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O1

void Ivy_FraigObjAddToFrontier(Ivy_FraigMan_t *p,Ivy_Obj_t *pObj,Vec_Ptr_t *vFrontier)

{
  uint uVar1;
  void **ppvVar2;
  int iVar3;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFraig.c"
                  ,0x9d9,
                  "void Ivy_FraigObjAddToFrontier(Ivy_FraigMan_t *, Ivy_Obj_t *, Vec_Ptr_t *)");
  }
  if (*(int *)&pObj->pNextFan0 != 0) {
    return;
  }
  if (pObj->pNextFan1 != (Ivy_Obj_t *)0x0) {
    __assert_fail("Ivy_ObjFaninVec(pObj) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFraig.c"
                  ,0x9dd,
                  "void Ivy_FraigObjAddToFrontier(Ivy_FraigMan_t *, Ivy_Obj_t *, Vec_Ptr_t *)");
  }
  if (pObj->Id == 0) {
    return;
  }
  iVar3 = p->nSatVars;
  p->nSatVars = iVar3 + 1;
  pObj->pNextFan0 = (Ivy_Obj_t *)(long)iVar3;
  if ((*(uint *)&pObj->field_0x8 & 0xf) - 7 < 0xfffffffe) {
    return;
  }
  uVar1 = vFrontier->nCap;
  if (vFrontier->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vFrontier->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(vFrontier->pArray,0x80);
      }
      vFrontier->pArray = ppvVar2;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar1 * 2;
      if (iVar3 <= (int)uVar1) goto LAB_007551cc;
      if (vFrontier->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar2 = (void **)realloc(vFrontier->pArray,(ulong)uVar1 << 4);
      }
      vFrontier->pArray = ppvVar2;
    }
    vFrontier->nCap = iVar3;
  }
LAB_007551cc:
  iVar3 = vFrontier->nSize;
  vFrontier->nSize = iVar3 + 1;
  vFrontier->pArray[iVar3] = pObj;
  return;
}

Assistant:

void Ivy_FraigObjAddToFrontier( Ivy_FraigMan_t * p, Ivy_Obj_t * pObj, Vec_Ptr_t * vFrontier )
{
    assert( !Ivy_IsComplement(pObj) );
    if ( Ivy_ObjSatNum(pObj) )
        return;
    assert( Ivy_ObjSatNum(pObj) == 0 );
    assert( Ivy_ObjFaninVec(pObj) == NULL );
    if ( Ivy_ObjIsConst1(pObj) )
        return;
//printf( "Assigning node %d number %d\n", pObj->Id, p->nSatVars );
    Ivy_ObjSetSatNum( pObj, p->nSatVars++ );
    if ( Ivy_ObjIsNode(pObj) )
        Vec_PtrPush( vFrontier, pObj );
}